

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O3

void __thiscall
bal::CnfL0Index::rollback
          (CnfL0Index *this,container_size_t size,container_size_t instances_size,
          container_size_t container_size)

{
  ulong uVar1;
  uint *puVar2;
  anon_struct_16_4_c3204e78 *paVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint container_offset;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  insertion_point_t insertion_point;
  insertion_point_t local_50;
  Container<unsigned_int> *local_40;
  uint *local_38;
  
  ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  ::rollback((ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              *)this,size,instances_size,container_size);
  container_offset = 0;
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .super_Container<bal::avl_tree_index_item_t>.size_ = 0;
  local_40 = &(this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
              super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
              .
              super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              .instances_;
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .instances_.size_ = 0;
  Container<unsigned_int>::append(local_40,0xffffffff,instances_size);
  if (container_size != 0) {
    do {
      puVar2 = ((this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                .
                super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
               .container_)->data_;
      uVar7 = (puVar2[(ulong)container_offset + 1] >> 1) - 1;
      uVar10 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
               super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
               .
               super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
               .instances_.size_;
      if (uVar10 <= uVar7) {
        Container<unsigned_int>::append
                  (local_40,0xffffffff,(puVar2[(ulong)container_offset + 1] >> 1) - uVar10);
      }
      local_50.super_container_index_insertion_point_t.version_stamp =
           (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
           super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
           .
           super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
           .super_Container<bal::avl_tree_index_item_t>.size_;
      uVar10 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
               super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
               .
               super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
               .instances_.data_[uVar7];
      if (uVar10 == 0xffffffff) {
        local_50.kind = btipkRoot;
      }
      else {
        paVar3 = (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                 super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                 .
                 super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
                 .super_Container<bal::avl_tree_index_item_t>.data_;
        puVar4 = ((this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                  .
                  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
                 .container_)->data_;
        local_38 = puVar4 + 2;
        do {
          while( true ) {
            uVar7 = uVar10;
            uVar12 = (ulong)paVar3[uVar7].container_offset;
            __compare_clauses_ = __compare_clauses_ + 1;
            uVar8 = puVar2[container_offset] & 0xffff;
            uVar9 = puVar4[uVar12] & 0xffff;
            uVar10 = puVar2[container_offset];
            if (uVar9 < uVar8) {
              uVar10 = puVar4[uVar12];
            }
            uVar10 = uVar10 & 0xffff;
            if (uVar10 != 0) break;
LAB_0010eac0:
            if (uVar9 <= uVar8) {
              uVar11 = (uint)(uVar8 != uVar9);
LAB_0010eacf:
              if (0 < (int)uVar11) goto LAB_0010eaeb;
              if (-1 < (int)uVar11) {
                local_50.kind = btipkCurrent;
                local_50.super_container_index_insertion_point_t.container_offset =
                     paVar3[uVar7].container_offset;
                local_50.offset = uVar7;
                if (local_50.super_container_index_insertion_point_t.container_offset != 0xffffffff)
                {
                  __assert_fail("offset_found == CONTAINER_END",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.cpp"
                                ,0x22,
                                "virtual void bal::CnfL0Index::rollback(const container_size_t, const container_size_t, const container_size_t)"
                               );
                }
                goto LAB_0010eb1f;
              }
            }
LAB_0010eada:
            uVar10 = paVar3[uVar7].left_offset;
            if (paVar3[uVar7].left_offset == 0xffffffff) {
              local_50.kind = btipkLeft;
              goto LAB_0010eb0f;
            }
          }
          if (puVar2[(ulong)container_offset + 1] == puVar4[uVar12 + 1]) {
            uVar13 = 0;
            do {
              if ((ulong)uVar10 - 1 == uVar13) goto LAB_0010eac0;
              lVar5 = uVar12 + uVar13;
              uVar1 = uVar13 + 1;
              lVar6 = uVar13 + 2;
              uVar13 = uVar1;
            } while (puVar2[(ulong)container_offset + lVar6] == local_38[lVar5]);
            uVar11 = (uint)(uVar8 != uVar9);
            if (uVar8 < uVar9) {
              uVar11 = 0xffffffff;
            }
            if (uVar1 < uVar10) {
              uVar11 = -(uint)(puVar2[(ulong)container_offset + lVar6] < local_38[lVar5]) | 1;
            }
            goto LAB_0010eacf;
          }
          if (puVar2[(ulong)container_offset + 1] < puVar4[uVar12 + 1]) goto LAB_0010eada;
LAB_0010eaeb:
          uVar10 = paVar3[uVar7].right_offset;
        } while (paVar3[uVar7].right_offset != 0xffffffff);
        local_50.kind = btipkRight;
      }
LAB_0010eb0f:
      local_50.super_container_index_insertion_point_t.container_offset = 0xffffffff;
      local_50.offset = uVar7;
LAB_0010eb1f:
      AvlTreesIndex<unsigned_int,_&bal::compare_clauses>::append
                (&this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>,&local_50,
                 container_offset);
      container_offset = (ushort)puVar2[container_offset] + container_offset + 1;
    } while (container_offset < container_size);
  }
  return;
}

Assistant:

void CnfL0Index::rollback(const container_size_t size,
                          const container_size_t instances_size,
                          const container_size_t container_size) {
        base_t::rollback(size, instances_size, container_size);
        this->size_ = 0;
        this->instances_.size_ = 0;
        this->instances_.append(CONTAINER_END, instances_size);
        container_offset_t container_offset = 0;
        while (container_offset < container_size) {
            const uint32_t* const p_clause = this->container_.data_ + container_offset;            
            insertion_point_t insertion_point;
            this->find(literal_t__variable_id(_clause_literal(p_clause, 0)), p_clause, insertion_point);
            container_offset_t offset_found = insertion_point.container_offset;
            assert(offset_found == CONTAINER_END);
            this->append(insertion_point, container_offset);
            container_offset += _clause_size(p_clause) + 1;
        };
    }